

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
::erase_meta_only(raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                  *this,const_iterator it)

{
  _Head_base<0UL,_unsigned_long,_false> *p_Var1;
  int iVar2;
  uint uVar3;
  ushort uVar4;
  ushort uVar5;
  ctrl_t h;
  char *pcVar6;
  size_t i;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  __m128i match;
  
  pcVar6 = it.inner_.ctrl_;
  if (-1 < *pcVar6) {
    this->size_ = this->size_ - 1;
    i = (long)pcVar6 - (long)this->ctrl_;
    auVar8[0] = -(*pcVar6 == -0x80);
    auVar8[1] = -(pcVar6[1] == -0x80);
    auVar8[2] = -(pcVar6[2] == -0x80);
    auVar8[3] = -(pcVar6[3] == -0x80);
    auVar8[4] = -(pcVar6[4] == -0x80);
    auVar8[5] = -(pcVar6[5] == -0x80);
    auVar8[6] = -(pcVar6[6] == -0x80);
    auVar8[7] = -(pcVar6[7] == -0x80);
    auVar8[8] = -(pcVar6[8] == -0x80);
    auVar8[9] = -(pcVar6[9] == -0x80);
    auVar8[10] = -(pcVar6[10] == -0x80);
    auVar8[0xb] = -(pcVar6[0xb] == -0x80);
    auVar8[0xc] = -(pcVar6[0xc] == -0x80);
    auVar8[0xd] = -(pcVar6[0xd] == -0x80);
    auVar8[0xe] = -(pcVar6[0xe] == -0x80);
    auVar8[0xf] = -(pcVar6[0xf] == -0x80);
    uVar4 = (ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf;
    pcVar6 = this->ctrl_ + (i - 0x10 & this->capacity_);
    auVar9[0] = -(*pcVar6 == -0x80);
    auVar9[1] = -(pcVar6[1] == -0x80);
    auVar9[2] = -(pcVar6[2] == -0x80);
    auVar9[3] = -(pcVar6[3] == -0x80);
    auVar9[4] = -(pcVar6[4] == -0x80);
    auVar9[5] = -(pcVar6[5] == -0x80);
    auVar9[6] = -(pcVar6[6] == -0x80);
    auVar9[7] = -(pcVar6[7] == -0x80);
    auVar9[8] = -(pcVar6[8] == -0x80);
    auVar9[9] = -(pcVar6[9] == -0x80);
    auVar9[10] = -(pcVar6[10] == -0x80);
    auVar9[0xb] = -(pcVar6[0xb] == -0x80);
    auVar9[0xc] = -(pcVar6[0xc] == -0x80);
    auVar9[0xd] = -(pcVar6[0xd] == -0x80);
    auVar9[0xe] = -(pcVar6[0xe] == -0x80);
    auVar9[0xf] = -(pcVar6[0xf] == -0x80);
    uVar5 = (ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf;
    if (uVar4 == 0 || uVar5 == 0) {
      bVar7 = false;
    }
    else {
      iVar2 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> iVar2 & 1) == 0; iVar2 = iVar2 + 1) {
        }
      }
      uVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; ((uint)uVar5 << 0x10) >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      bVar7 = (uVar3 ^ 0x1f) + iVar2 < 0x10;
    }
    h = -2;
    if (bVar7 != false) {
      h = -0x80;
    }
    set_ctrl(this,i,h);
    p_Var1 = &(this->settings_).
              super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
              .super__Head_base<0UL,_unsigned_long,_false>;
    p_Var1->_M_head_impl = p_Var1->_M_head_impl + (ulong)bVar7;
    return;
  }
  __assert_fail("IsFull(*it.inner_.ctrl_) && \"erasing a dangling iterator\"",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x7c8,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<int>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<>>::erase_meta_only(const_iterator) [Policy = phmap::priv::FlatHashSetPolicy<int>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<>]"
               );
}

Assistant:

inline bool IsFull(ctrl_t c)           { return c >= static_cast<ctrl_t>(0); }